

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O1

bool __thiscall DPlayerMenu::MenuEvent(DPlayerMenu *this,int mkey,bool fromcontroller)

{
  FListMenuDescriptor *pFVar1;
  FListMenuItem *li;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined8 *puVar6;
  uint uVar7;
  long lVar8;
  ECVarType type;
  uint green;
  char *pcVar9;
  uint red;
  char *val;
  UCVarValue value;
  DPlayerMenu *this_00;
  FIntCVar *this_01;
  int v;
  FName current;
  undefined1 local_38 [8];
  
  pFVar1 = (this->super_DListMenu).mDesc;
  lVar8 = (long)pFVar1->mSelectedItem;
  if (lVar8 < 0) goto LAB_00340254;
  li = (pFVar1->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[lVar8];
  local_38 = (undefined1  [8])in_RAX;
  iVar4 = (*li->_vptr_FListMenuItem[0xd])(li,mkey,(ulong)fromcontroller);
  if ((char)iVar4 == '\0') goto LAB_00340254;
  this_00 = (DPlayerMenu *)(local_38 + 4);
  (*li->_vptr_FListMenuItem[7])(this_00,li,0);
  switch(local_38._4_4_) {
  case 0x1e4:
    if (mkey == 10) {
      PlayerNameChanged(this_00,li);
    }
    break;
  case 0x1e5:
    iVar5 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_38);
    if ((char)iVar5 != '\0') {
      value = (UCVarValue)0xff;
      if (local_38._0_4_ != 0) {
        value._4_4_ = 0;
        value.Int = local_38._0_4_ - 1;
      }
      this_01 = &team;
      type = CVAR_Int;
LAB_003401b8:
      FBaseCVar::SetGenericRep(&this_01->super_FBaseCVar,value,type);
    }
    break;
  case 0x1e6:
    ColorSetChanged(this,li);
    break;
  case 0x1e7:
    iVar5 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_38);
    if ((char)iVar5 != '\0') {
      puVar2 = (undefined8 *)
               ((ulong)(((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
               (&DAT_00a392c8)[(long)consoleplayer * 0x54]);
      do {
        puVar6 = puVar2;
        puVar2 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x1e6);
      uVar7 = *(uint *)(puVar6[2] + 0x28);
      green = uVar7 >> 8 & 0xff;
      red = local_38._0_4_;
LAB_00340133:
      local_38._0_4_ = uVar7 & 0xff;
LAB_0034022e:
      SendNewColor(this,red,green,local_38._0_4_);
    }
    break;
  case 0x1e8:
    iVar5 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_38);
    if ((char)iVar5 != '\0') {
      puVar2 = (undefined8 *)
               ((ulong)(((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
               (&DAT_00a392c8)[(long)consoleplayer * 0x54]);
      do {
        puVar6 = puVar2;
        puVar2 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x1e6);
      uVar7 = *(uint *)(puVar6[2] + 0x28);
      red = uVar7 >> 0x10 & 0xff;
      green = local_38._0_4_;
      goto LAB_00340133;
    }
    break;
  case 0x1e9:
    iVar5 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_38);
    if ((char)iVar5 != '\0') {
      puVar2 = (undefined8 *)
               ((ulong)(((&DAT_00a392d8)[(long)consoleplayer * 0xa8] - 1 & 0x1e6) * 0x18) +
               (&DAT_00a392c8)[(long)consoleplayer * 0x54]);
      do {
        puVar6 = puVar2;
        puVar2 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x1e6);
      red = *(uint *)(puVar6[2] + 0x28) >> 0x10 & 0xff;
      green = *(uint *)(puVar6[2] + 0x28) >> 8 & 0xff;
      goto LAB_0034022e;
    }
    break;
  case 0x1ea:
    SkinChanged(this,li);
    break;
  case 0x1eb:
    iVar5 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_38);
    if ((char)iVar5 != '\0') {
      pcVar9 = "other";
      if (local_38._0_4_ == 1) {
        pcVar9 = "female";
      }
      val = "male";
      if (local_38._0_4_ != 0) {
        val = pcVar9;
      }
      cvar_set("gender",val);
    }
    break;
  case 0x1ec:
    AutoaimChanged(this_00,li);
    break;
  case 0x1ed:
    iVar5 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_38);
    if ((char)iVar5 != '\0') {
      this_01 = (FIntCVar *)&neverswitchonpickup;
LAB_003400a1:
      value._1_7_ = 0;
      value.Bool = local_38._0_4_ != 0;
      type = CVAR_Bool;
      goto LAB_003401b8;
    }
    break;
  default:
    if (local_38._4_4_ == 5) {
      ClassChanged(this,li);
    }
    else if ((local_38._4_4_ == 0x20f) &&
            (iVar5 = (*li->_vptr_FListMenuItem[0xb])(li,0,local_38), (char)iVar5 != '\0')) {
      this_01 = (FIntCVar *)&cl_run;
      goto LAB_003400a1;
    }
  }
  if ((char)iVar4 != '\0') {
    return true;
  }
LAB_00340254:
  bVar3 = DListMenu::MenuEvent(&this->super_DListMenu,mkey,fromcontroller);
  return bVar3;
}

Assistant:

bool DPlayerMenu::MenuEvent (int mkey, bool fromcontroller)
{
	int v;
	if (mDesc->mSelectedItem >= 0)
	{
		FListMenuItem *li = mDesc->mItems[mDesc->mSelectedItem];
		if (li->MenuEvent(mkey, fromcontroller))
		{
			FName current = li->GetAction(NULL);
			switch(current)
			{
				// item specific handling comes here

			case NAME_Playerbox:
				if (mkey == MKEY_Input)
				{
					PlayerNameChanged(li);
				}
				break;

			case NAME_Team:
				if (li->GetValue(0, &v))
				{
					team = v==0? TEAM_NONE : v-1;
				}
				break;

			case NAME_Color:
					ColorSetChanged(li);
					break;

			case NAME_Red:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (v, GPART(color), BPART(color));
				}
				break;

			case NAME_Green:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), v, BPART(color));
				}
				break;

			case NAME_Blue:
				if (li->GetValue(0, &v))
				{
					uint32 color = players[consoleplayer].userinfo.GetColor();
					SendNewColor (RPART(color), GPART(color), v);
				}
				break;

			case NAME_Class:
				ClassChanged(li);
				break;

			case NAME_Skin:
				SkinChanged(li);
				break;

			case NAME_Gender:
				if (li->GetValue(0, &v))
				{
					cvar_set ("gender", v==0? "male" : v==1? "female" : "other");
				}
				break;

			case NAME_Autoaim:
				AutoaimChanged(li);
				break;

			case NAME_Switch:
				if (li->GetValue(0, &v))
				{
					neverswitchonpickup = !!v;
				}
				break;

			case NAME_AlwaysRun:
				if (li->GetValue(0, &v))
				{
					cl_run = !!v;
				}
				break;

			default:
				break;
			}
			return true;
		}
	}
	return Super::MenuEvent(mkey, fromcontroller);
}